

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFListTable.cpp
# Opt level: O1

Error __thiscall
llvm::DWARFListTableHeader::extract
          (DWARFListTableHeader *this,DWARFDataExtractor Data,uint64_t *OffsetPtr)

{
  ulong uVar1;
  iterator __position;
  uint8_t uVar2;
  uint16_t uVar3;
  uint32_t uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  char *pcVar7;
  ulong uVar8;
  char *pcVar9;
  uint64_t *in_RDX;
  uint64_t *Vals_1;
  uint64_t *Vals_2;
  long lVar10;
  uint uVar11;
  error_code EC;
  error_code EC_00;
  error_code EC_01;
  error_code EC_02;
  error_code EC_03;
  uint64_t local_48;
  uint64_t FullLength;
  uint64_t local_38;
  
  OffsetPtr[6] = *in_RDX;
  if ((0xfffffffffffffffb < *in_RDX) || (Data.super_DataExtractor.Data.Length <= *in_RDX + 3)) {
    pcVar7 = (char *)std::_V2::generic_category();
    local_48 = OffsetPtr[7];
    EC._M_cat = (error_category *)0x16;
    EC._0_8_ = this;
    createStringError<char_const*,unsigned_long>
              (EC,pcVar7,
               (char **)"section is not large enough to contain a %s table length at offset 0x%lx",
               &local_48);
    return (Error)(ErrorInfoBase *)this;
  }
  Vals_2 = OffsetPtr + 6;
  *(undefined1 *)(OffsetPtr + 5) = 0;
  FullLength._4_4_ = 4;
  uVar5 = DWARFDataExtractor::getRelocatedValue(&Data,4,in_RDX,(uint64_t *)0x0,(Error *)0x0);
  *OffsetPtr = uVar5;
  if (uVar5 == 0xffffffff) {
    *(undefined1 *)(OffsetPtr + 5) = 1;
    uVar5 = DataExtractor::getU64(&Data.super_DataExtractor,in_RDX,(Error *)0x0);
    *OffsetPtr = uVar5;
    FullLength._4_4_ = 8;
  }
  else if (0xffffffe < uVar5 >> 4) {
    pcVar7 = (char *)std::_V2::generic_category();
    local_48 = OffsetPtr[7];
    Vals_1 = &local_48;
    pcVar9 = "%s table at offset 0x%lx has unsupported reserved unit length of value 0x%8.8lx";
    goto LAB_00d8de64;
  }
  uVar5 = *OffsetPtr;
  lVar10 = 4;
  if ((char)OffsetPtr[5] != '\0') {
    if ((char)OffsetPtr[5] != '\x01') {
      llvm_unreachable_internal
                ("Invalid Format value",
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/BinaryFormat/Dwarf.h"
                 ,0x23e);
    }
    lVar10 = 0xc;
  }
  local_48 = lVar10 + uVar5;
  uVar6 = length((DWARFListTableHeader *)OffsetPtr);
  if (lVar10 + uVar5 != uVar6) {
    __assert_fail("FullLength == length()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/DWARFListTable.cpp"
                  ,0x2a,"Error llvm::DWARFListTableHeader::extract(DWARFDataExtractor, uint64_t *)")
    ;
  }
  uVar8 = 0xc;
  if ((char)OffsetPtr[5] != '\0') {
    if ((char)OffsetPtr[5] != '\x01') goto LAB_00d8dfcf;
    uVar8 = 0x14;
  }
  if (local_48 < uVar8) {
    pcVar7 = (char *)std::_V2::generic_category();
    local_38 = OffsetPtr[7];
    Vals_1 = &local_38;
    pcVar9 = "%s table at offset 0x%lx has too small length (0x%lx) to contain a complete header";
  }
  else {
    uVar1 = *Vals_2;
    uVar8 = uVar1 + local_48;
    if ((uVar1 <= uVar8) && ((local_48 + uVar1) - 1 < Data.super_DataExtractor.Data.Length)) {
      uVar3 = DataExtractor::getU16(&Data.super_DataExtractor,in_RDX,(Error *)0x0);
      *(uint16_t *)(OffsetPtr + 1) = uVar3;
      uVar2 = DataExtractor::getU8(&Data.super_DataExtractor,in_RDX,(Error *)0x0);
      *(uint8_t *)((long)OffsetPtr + 10) = uVar2;
      uVar2 = DataExtractor::getU8(&Data.super_DataExtractor,in_RDX,(Error *)0x0);
      *(uint8_t *)((long)OffsetPtr + 0xb) = uVar2;
      uVar4 = DataExtractor::getU32(&Data.super_DataExtractor,in_RDX,(Error *)0x0);
      *(uint32_t *)((long)OffsetPtr + 0xc) = uVar4;
      if ((short)OffsetPtr[1] != 5) {
        pcVar7 = (char *)std::_V2::generic_category();
        local_38 = OffsetPtr[7];
        EC_01._M_cat = (error_category *)0x16;
        EC_01._0_8_ = this;
        createStringError<char_const*,unsigned_short,unsigned_long>
                  (EC_01,pcVar7,(char **)"unrecognised %s table version %u in table at offset 0x%lx"
                   ,(unsigned_short *)&local_38,OffsetPtr + 1);
        return (Error)(ErrorInfoBase *)this;
      }
      uVar2 = *(uint8_t *)((long)OffsetPtr + 10);
      if ((uVar2 == '\x04') || (uVar2 == '\b')) {
        if (*(char *)((long)OffsetPtr + 0xb) == '\0') {
          lVar10 = 0xc;
          if ((char)OffsetPtr[5] != '\0') {
            if ((char)OffsetPtr[5] != '\x01') {
LAB_00d8dfcf:
              llvm_unreachable_internal
                        ("Invalid DWARF format (expected DWARF32 or DWARF64",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/DebugInfo/DWARF/DWARFListTable.h"
                         ,0x73);
            }
            lVar10 = 0x14;
          }
          if (uVar8 < OffsetPtr[6] + (ulong)(uVar4 * FullLength._4_4_) + lVar10) {
            pcVar7 = (char *)std::_V2::generic_category();
            local_38 = OffsetPtr[7];
            EC_03._M_cat = (error_category *)0x16;
            EC_03._0_8_ = this;
            createStringError<char_const*,unsigned_long,unsigned_int>
                      (EC_03,pcVar7,
                       (char **)
                       "%s table at offset 0x%lx has more offset entries (%u) than there is space for"
                       ,&local_38,(uint *)Vals_2);
            return (Error)(ErrorInfoBase *)this;
          }
          if (*(uint *)((long)OffsetPtr + 0xc) != 0) {
            uVar11 = 0;
            Data.super_DataExtractor.AddressSize = uVar2;
            do {
              local_38 = DWARFDataExtractor::getRelocatedValue
                                   (&Data,FullLength._4_4_,in_RDX,(uint64_t *)0x0,(Error *)0x0);
              __position._M_current = (unsigned_long *)OffsetPtr[3];
              if (__position._M_current == (unsigned_long *)OffsetPtr[4]) {
                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                _M_realloc_insert<unsigned_long>
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(OffsetPtr + 2),
                           __position,&local_38);
              }
              else {
                *__position._M_current = local_38;
                OffsetPtr[3] = (uint64_t)(__position._M_current + 1);
              }
              uVar11 = uVar11 + 1;
            } while (uVar11 < *(uint *)((long)OffsetPtr + 0xc));
          }
          (this->HeaderData).Length = 1;
          return (Error)(ErrorInfoBase *)this;
        }
        pcVar7 = (char *)std::_V2::generic_category();
        local_38 = OffsetPtr[7];
        pcVar9 = "%s table at offset 0x%lx has unsupported segment selector size %u";
      }
      else {
        pcVar7 = (char *)std::_V2::generic_category();
        local_38 = OffsetPtr[7];
        pcVar9 = "%s table at offset 0x%lx has unsupported address size %u";
      }
      EC_02._M_cat = (error_category *)0x5f;
      EC_02._0_8_ = this;
      createStringError<char_const*,unsigned_long,unsigned_char>
                (EC_02,pcVar7,(char **)pcVar9,&local_38,(uchar *)Vals_2);
      return (Error)(ErrorInfoBase *)this;
    }
    pcVar7 = (char *)std::_V2::generic_category();
    local_38 = OffsetPtr[7];
    Vals_1 = &local_38;
    pcVar9 = "section is not large enough to contain a %s table of length 0x%lx at offset 0x%lx";
    Vals_2 = &local_48;
  }
LAB_00d8de64:
  EC_00._M_cat = (error_category *)0x16;
  EC_00._0_8_ = this;
  createStringError<char_const*,unsigned_long,unsigned_long>
            (EC_00,pcVar7,(char **)pcVar9,Vals_1,Vals_2);
  return (Error)(ErrorInfoBase *)this;
}

Assistant:

Error DWARFListTableHeader::extract(DWARFDataExtractor Data,
                                    uint64_t *OffsetPtr) {
  HeaderOffset = *OffsetPtr;
  // Read and verify the length field.
  if (!Data.isValidOffsetForDataOfSize(*OffsetPtr, sizeof(uint32_t)))
    return createStringError(errc::invalid_argument,
                       "section is not large enough to contain a "
                       "%s table length at offset 0x%" PRIx64,
                       SectionName.data(), *OffsetPtr);
  Format = dwarf::DwarfFormat::DWARF32;
  uint8_t OffsetByteSize = 4;
  HeaderData.Length = Data.getRelocatedValue(4, OffsetPtr);
  if (HeaderData.Length == dwarf::DW_LENGTH_DWARF64) {
    Format = dwarf::DwarfFormat::DWARF64;
    OffsetByteSize = 8;
    HeaderData.Length = Data.getU64(OffsetPtr);
  } else if (HeaderData.Length >= dwarf::DW_LENGTH_lo_reserved) {
    return createStringError(errc::invalid_argument,
        "%s table at offset 0x%" PRIx64
        " has unsupported reserved unit length of value 0x%8.8" PRIx64,
        SectionName.data(), HeaderOffset, HeaderData.Length);
  }
  uint64_t FullLength =
      HeaderData.Length + dwarf::getUnitLengthFieldByteSize(Format);
  assert(FullLength == length());
  if (FullLength < getHeaderSize(Format))
    return createStringError(errc::invalid_argument,
                       "%s table at offset 0x%" PRIx64
                       " has too small length (0x%" PRIx64
                       ") to contain a complete header",
                       SectionName.data(), HeaderOffset, FullLength);
  uint64_t End = HeaderOffset + FullLength;
  if (!Data.isValidOffsetForDataOfSize(HeaderOffset, FullLength))
    return createStringError(errc::invalid_argument,
                       "section is not large enough to contain a %s table "
                       "of length 0x%" PRIx64 " at offset 0x%" PRIx64,
                       SectionName.data(), FullLength, HeaderOffset);

  HeaderData.Version = Data.getU16(OffsetPtr);
  HeaderData.AddrSize = Data.getU8(OffsetPtr);
  HeaderData.SegSize = Data.getU8(OffsetPtr);
  HeaderData.OffsetEntryCount = Data.getU32(OffsetPtr);

  // Perform basic validation of the remaining header fields.
  if (HeaderData.Version != 5)
    return createStringError(errc::invalid_argument,
                       "unrecognised %s table version %" PRIu16
                       " in table at offset 0x%" PRIx64,
                       SectionName.data(), HeaderData.Version, HeaderOffset);
  if (HeaderData.AddrSize != 4 && HeaderData.AddrSize != 8)
    return createStringError(errc::not_supported,
                       "%s table at offset 0x%" PRIx64
                       " has unsupported address size %" PRIu8,
                       SectionName.data(), HeaderOffset, HeaderData.AddrSize);
  if (HeaderData.SegSize != 0)
    return createStringError(errc::not_supported,
                       "%s table at offset 0x%" PRIx64
                       " has unsupported segment selector size %" PRIu8,
                       SectionName.data(), HeaderOffset, HeaderData.SegSize);
  if (End < HeaderOffset + getHeaderSize(Format) +
                HeaderData.OffsetEntryCount * OffsetByteSize)
    return createStringError(errc::invalid_argument,
        "%s table at offset 0x%" PRIx64 " has more offset entries (%" PRIu32
        ") than there is space for",
        SectionName.data(), HeaderOffset, HeaderData.OffsetEntryCount);
  Data.setAddressSize(HeaderData.AddrSize);
  for (uint32_t I = 0; I < HeaderData.OffsetEntryCount; ++I)
    Offsets.push_back(Data.getRelocatedValue(OffsetByteSize, OffsetPtr));
  return Error::success();
}